

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O0

void subflow_starvation(size_t W)

{
  code *pcVar1;
  byte extraout_AL;
  Executor *this;
  undefined1 *__stat_loc;
  Executor *in_RDI;
  double __x;
  Expression_lhs<const_unsigned_long_&> EVar2;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  atomic<unsigned_long> barrier;
  atomic<unsigned_long> counter;
  Executor executor;
  Taskflow taskflow;
  ResultBuilder DOCTEST_RB;
  size_t B;
  size_t L;
  Result *res;
  Taskflow *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined1 *repeat;
  char *in_stack_fffffffffffffc00;
  Taskflow *f;
  undefined8 in_stack_fffffffffffffc08;
  Taskflow *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc20;
  anon_class_64_8_0ad75d79 *in_stack_fffffffffffffc30;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffffc38;
  unsigned_long *in_stack_fffffffffffffc70;
  Expression_lhs<const_unsigned_long_&> *in_stack_fffffffffffffc78;
  undefined1 local_368 [64];
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffcd8;
  size_t in_stack_fffffffffffffce0;
  Executor *in_stack_fffffffffffffce8;
  undefined1 local_2e8 [512];
  Executor *local_e8;
  Enum local_e0;
  ExpressionDecomposer local_c4;
  Executor *local_c0;
  Enum local_b8;
  ResultBuilder local_90;
  undefined8 local_18;
  undefined8 local_10;
  Executor *local_8;
  
  local_10 = 100;
  local_18 = 0x400;
  res = (Result *)0x18308d;
  local_8 = in_RDI;
  doctest::detail::ResultBuilder::ResultBuilder
            ((ResultBuilder *)in_stack_fffffffffffffc10,
             (Enum)((ulong)in_stack_fffffffffffffc08 >> 0x20),in_stack_fffffffffffffc00,
             (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),(char *)in_stack_fffffffffffffbf0,"",
             in_stack_fffffffffffffc20);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_c4,DT_REQUIRE);
  EVar2 = doctest::detail::ExpressionDecomposer::operator<<<unsigned_long,_nullptr>
                    ((ExpressionDecomposer *)in_stack_fffffffffffffbf0,(unsigned_long *)res);
  this = (Executor *)EVar2.lhs;
  local_e0 = EVar2.m_at;
  local_e8 = this;
  local_c0 = this;
  local_b8 = local_e0;
  doctest::detail::Expression_lhs<const_unsigned_long_&>::operator><unsigned_long,_nullptr>
            (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
  doctest::detail::ResultBuilder::setResult((ResultBuilder *)in_stack_fffffffffffffbf0,res);
  doctest::detail::Result::~Result((Result *)0x118d29);
  doctest::detail::ResultBuilder::log(&local_90,__x);
  if ((extraout_AL & 1) == 0) {
    doctest::detail::ResultBuilder::react((ResultBuilder *)in_stack_fffffffffffffbf0);
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x118dfc);
    tf::Taskflow::Taskflow(in_stack_fffffffffffffc10);
    std::shared_ptr<tf::WorkerInterface>::shared_ptr
              ((shared_ptr<tf::WorkerInterface> *)in_stack_fffffffffffffbf0,res);
    tf::Executor::Executor
              (in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
    std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x118e52);
    f = (Taskflow *)(local_368 + 0x38);
    std::mutex::mutex((mutex *)0x118e7c);
    repeat = local_368;
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
              ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
               0x118e8e);
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_work_stealing_cpp:316:20),_nullptr>
              ((FlowBuilder *)in_stack_fffffffffffffc38._M_pi,in_stack_fffffffffffffc30);
    __stat_loc = local_2e8;
    tf::Executor::run_n(local_8,f,(size_t)repeat);
    std::__basic_future<void>::wait((__basic_future<void> *)&stack0xfffffffffffffc30,__stat_loc);
    tf::Future<void>::~Future((Future<void> *)in_stack_fffffffffffffbf0);
    std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   0x118f5f);
    tf::Executor::~Executor(this);
    tf::Taskflow::~Taskflow(in_stack_fffffffffffffbf0);
    return;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void subflow_starvation(size_t W) {

  size_t L=100, B = 1024;

  REQUIRE(B > W);
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> counter{0};
  std::atomic<size_t> barrier{0};

  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  taskflow.emplace([&](tf::Subflow& subflow){

    auto [merge, cond, stop] = subflow.emplace(
      [&](){  
        REQUIRE(barrier.load(std::memory_order_relaxed) == B);
        REQUIRE(counter.load(std::memory_order_relaxed) == (L + B - 1));
        REQUIRE(set.size() == W);
        counter = 0;
        barrier = 0;
        set.clear();
      },
      [n=0]() mutable { 
        return ++n >= 5 ? 1 : 0;
      },
      [&](){
        REQUIRE(barrier.load(std::memory_order_relaxed) == 0);
        REQUIRE(counter.load(std::memory_order_relaxed) == 0);
        REQUIRE(set.size() == 0);
      }
    );

    tf::Task prev, curr, second;
    
    // linear chain with delay to make workers sleep
    for(size_t l=0; l<L; l++) {

      curr = subflow.emplace([&, l](){
        if(l) {
          counter.fetch_add(1, std::memory_order_relaxed);
        }
      });

      if(l) {
        curr.succeed(prev);
      }

      if(l==1) {
        second = curr;
      }

      prev = curr;
    }
    
    cond.precede(second, stop);


    // fork
    for(size_t b=0; b<B; b++) {
      tf::Task task = subflow.emplace([&](){
        // record the threads
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }

        // all threads should be notified
        barrier.fetch_add(1, std::memory_order_relaxed);
        while(barrier.load(std::memory_order_relaxed) < W) {
          std::this_thread::yield();
        }
        
        // increment the counter
        counter.fetch_add(1, std::memory_order_relaxed);
      });
      task.succeed(curr)
          .precede(merge);
    }

    merge.precede(cond);
  });

  //taskflow.dump(std::cout);
  executor.run_n(taskflow, 5).wait();
}